

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextboundaryfinder.cpp
# Opt level: O1

BoundaryReasons __thiscall QTextBoundaryFinder::boundaryReasons(QTextBoundaryFinder *this)

{
  QCharAttributes QVar1;
  long lVar2;
  long lVar3;
  byte bVar4;
  
  if (this->attributes == (QCharAttributes *)0x0) {
    return (BoundaryReasons)0;
  }
  lVar2 = this->pos;
  if (lVar2 < 0) {
    return (BoundaryReasons)0;
  }
  lVar3 = (this->sv).m_size;
  if (lVar3 < lVar2) {
    return (BoundaryReasons)0;
  }
  if (this->t < 4) {
    QVar1 = this->attributes[lVar2];
    switch(this->t) {
    case Grapheme:
      bVar4 = (byte)QVar1 & 1;
      break;
    case Word:
      if (((byte)QVar1 & 2) == 0) {
        return (BoundaryReasons)0;
      }
      return (QFlagsStorageHelper<QTextBoundaryFinder::BoundaryReason,_4>)
             (QFlagsStorageHelper<QTextBoundaryFinder::BoundaryReason,_4>)
             ((byte)QVar1 & 0x60 | 0x1f);
    case Sentence:
      bVar4 = (byte)QVar1 & 4;
      break;
    case Line:
      if ((lVar2 != 0) && (((byte)QVar1 & 8) == 0)) {
        return (BoundaryReasons)0;
      }
      if ((lVar2 != 0) && (-1 < (char)QVar1)) {
        return (QFlagsStorageHelper<QTextBoundaryFinder::BoundaryReason,_4>)
               (QFlagsStorageHelper<QTextBoundaryFinder::BoundaryReason,_4>)
               ((uint)((this->sv).m_data[lVar2 + -1] == L'­') << 8 | 0x1f);
      }
      if (lVar2 == 0) {
        return (QFlagsStorageHelper<QTextBoundaryFinder::BoundaryReason,_4>)
               (QFlagsStorage<QTextBoundaryFinder::BoundaryReason>)0xbf;
      }
      return (QFlagsStorageHelper<QTextBoundaryFinder::BoundaryReason,_4>)
             (QFlagsStorageHelper<QTextBoundaryFinder::BoundaryReason,_4>)
             ((uint)(lVar2 != lVar3) << 5 | 0xdf);
    }
    if (bVar4 == 0) {
      return (QFlagsStorageHelper<QTextBoundaryFinder::BoundaryReason,_4>)
             (QFlagsStorage<QTextBoundaryFinder::BoundaryReason>)0x0;
    }
    if (lVar2 == 0) {
      return (QFlagsStorageHelper<QTextBoundaryFinder::BoundaryReason,_4>)
             (QFlagsStorage<QTextBoundaryFinder::BoundaryReason>)0x3f;
    }
    return (QFlagsStorageHelper<QTextBoundaryFinder::BoundaryReason,_4>)
           (QFlagsStorageHelper<QTextBoundaryFinder::BoundaryReason,_4>)
           ((uint)(lVar2 != lVar3) << 5 | 0x5f);
  }
  return (BoundaryReasons)0;
}

Assistant:

QTextBoundaryFinder::BoundaryReasons QTextBoundaryFinder::boundaryReasons() const
{
    BoundaryReasons reasons = NotAtBoundary;
    if (!attributes || pos < 0 || pos > sv.size())
        return reasons;

    const QCharAttributes attr = attributes[pos];
    switch (t) {
    case Grapheme:
        if (attr.graphemeBoundary) {
            reasons |= BreakOpportunity | StartOfItem | EndOfItem;
            if (pos == 0)
                reasons &= (~EndOfItem);
            else if (pos == sv.size())
                reasons &= (~StartOfItem);
        }
        break;
    case Word:
        if (attr.wordBreak) {
            reasons |= BreakOpportunity;
            if (attr.wordStart)
                reasons |= StartOfItem;
            if (attr.wordEnd)
                reasons |= EndOfItem;
        }
        break;
    case Sentence:
        if (attr.sentenceBoundary) {
            reasons |= BreakOpportunity | StartOfItem | EndOfItem;
            if (pos == 0)
                reasons &= (~EndOfItem);
            else if (pos == sv.size())
                reasons &= (~StartOfItem);
        }
        break;
    case Line:
        // ### TR#14 LB2 prohibits break at sot
        if (attr.lineBreak || pos == 0) {
            reasons |= BreakOpportunity;
            if (attr.mandatoryBreak || pos == 0) {
                reasons |= MandatoryBreak | StartOfItem | EndOfItem;
                if (pos == 0)
                    reasons &= (~EndOfItem);
                else if (pos == sv.size())
                    reasons &= (~StartOfItem);
            } else if (pos > 0 && sv[pos - 1].unicode() == QChar::SoftHyphen) {
                reasons |= SoftHyphen;
            }
        }
        break;
    default:
        break;
    }

    return reasons;
}